

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::fboc::details::AttachmentTest::makeDepthAndStencil
          (AttachmentTest *this,FboBuilder *builder)

{
  _Rb_tree_header *p_Var1;
  GLenum context;
  ImageFormat format;
  FormatFlags FVar2;
  Attachment *att;
  _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  local_58;
  
  context = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.stencilKind
  ;
  if (context ==
      (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.depthKind) {
    FVar2 = FboUtil::formatFlag(context);
    FboUtil::FormatDB::getFormats
              ((Formats *)&local_58,
               &((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).super_TestBase.
                m_ctx)->m_coreFormats,FVar2 | (STENCIL_RENDERABLE|DEPTH_RENDERABLE));
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&local_58);
    }
    else {
      format.format = local_58._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      format.unsizedType =
           *(GLenum *)&local_58._M_impl.super__Rb_tree_header._M_header._M_left[1].field_0x4;
      att = makeAttachment((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).
                           m_params.depthKind,format,0x40,0x40,builder);
      FboUtil::FboBuilder::glAttach(builder,0x8d00,att);
      FboUtil::FboBuilder::glAttach(builder,0x8d20,att);
      std::
      _Rb_tree<deqp::gls::FboUtil::ImageFormat,_deqp::gls::FboUtil::ImageFormat,_std::_Identity<deqp::gls::FboUtil::ImageFormat>,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~_Rb_tree(&local_58);
      if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        return;
      }
    }
  }
  TestBase::attachTargetToNew
            ((TestBase *)this,0x8d20,
             (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.
             stencilKind,(ImageFormat)0x0,0x40,0x40,builder);
  TestBase::attachTargetToNew
            ((TestBase *)this,0x8d00,
             (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.depthKind,
             (ImageFormat)0x0,0x40,0x40,builder);
  return;
}

Assistant:

void AttachmentTest::makeDepthAndStencil (FboBuilder& builder)
{
	if (m_params.stencilKind == m_params.depthKind)
	{
		// If there is a common stencil+depth -format, try to use a common
		// image for both attachments.
		const FormatFlags flags =
			DEPTH_RENDERABLE | STENCIL_RENDERABLE | formatFlag(m_params.stencilKind);
		const Formats& formats = m_ctx.getCoreFormats().getFormats(flags);
		Formats::const_iterator it = formats.begin();
		if (it != formats.end())
		{
			const ImageFormat format = *it;
			Attachment* att = makeAttachment(m_params.depthKind, format, 64, 64, builder);
			builder.glAttach(GL_DEPTH_ATTACHMENT, att);
			builder.glAttach(GL_STENCIL_ATTACHMENT, att);
			return;
		}
	}
	// Either the kinds were separate, or a suitable format was not found.
	// Create separate images.
	attachTargetToNew(GL_STENCIL_ATTACHMENT, m_params.stencilKind, ImageFormat::none(),
					  64, 64, builder);
	attachTargetToNew(GL_DEPTH_ATTACHMENT, m_params.depthKind, ImageFormat::none(),
					  64, 64, builder);
}